

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O1

void Ptex::v2_2::PtexUtils::anon_unknown_1::average<unsigned_char>
               (uchar *src,int sstride,int uw,int vw,uchar *dst,int nchan)

{
  uchar *puVar1;
  long lVar2;
  uchar *puVar3;
  int iVar4;
  ulong uVar5;
  void *__s;
  undefined8 uStack_40;
  float local_38;
  int local_34;
  
  lVar2 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_38 + lVar2);
  local_38 = (float)vw;
  local_34 = uw;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x117209;
  memset(__s,0,(long)nchan << 2);
  if ((int)local_38 * sstride != 0) {
    puVar3 = src + (int)local_38 * sstride;
    iVar4 = nchan * local_34;
    do {
      if (iVar4 != 0) {
        puVar1 = src + iVar4;
        do {
          if (0 < nchan) {
            uVar5 = 0;
            do {
              *(float *)((long)__s + uVar5 * 4) =
                   (float)src[uVar5] + *(float *)((long)__s + uVar5 * 4);
              uVar5 = uVar5 + 1;
            } while ((uint)nchan != uVar5);
            src = src + uVar5;
          }
        } while (src != puVar1);
      }
      src = src + (sstride - iVar4);
    } while (src != puVar3);
  }
  if (0 < nchan) {
    uVar5 = 0;
    do {
      dst[uVar5] = (uchar)(int)(*(float *)((long)__s + uVar5 * 4) *
                               (1.0 / (float)((int)local_38 * local_34)));
      uVar5 = uVar5 + 1;
    } while ((uint)nchan != uVar5);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }